

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RangeReader.h
# Opt level: O2

ssize_t __thiscall RangeReader::write(RangeReader *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 *puVar2;
  undefined4 in_register_00000034;
  
  if (__buf <= (void *)(this->_endofs - this->_curpos)) {
    iVar1 = (*((this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_ReadWriter[3])();
    this->_curpos = this->_curpos + (long)__buf;
    return CONCAT44(extraout_var,iVar1);
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8,CONCAT44(in_register_00000034,__fd));
  *puVar2 = "write beyond limit";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

virtual void write(const uint8_t *p, size_t n)
    {
        size_t want= (size_t)std::min(uint64_t(n), _endofs-_curpos);
        if (want<n)
            throw "write beyond limit";
        _r->write(p, want);
        _curpos += want;
    }